

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void BinarySink_put_mp_ssh2(BinarySink *bs,mp_int *x)

{
  BinarySink *bs_00;
  uint8_t val;
  size_t sVar1;
  ulong local_28;
  size_t i;
  size_t bytes;
  mp_int *x_local;
  BinarySink *bs_local;
  
  sVar1 = mp_get_nbits(x);
  local_28 = sVar1 + 8 >> 3;
  BinarySink_put_uint32(bs->binarysink_,local_28);
  while (local_28 != 0) {
    bs_00 = bs->binarysink_;
    val = mp_get_byte(x,local_28 - 1);
    BinarySink_put_byte(bs_00,val);
    local_28 = local_28 - 1;
  }
  return;
}

Assistant:

void BinarySink_put_mp_ssh2(BinarySink *bs, mp_int *x)
{
    size_t bytes = (mp_get_nbits(x) + 8) / 8;

    put_uint32(bs, bytes);
    for (size_t i = bytes; i-- > 0 ;)
        put_byte(bs, mp_get_byte(x, i));
}